

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Min::forward_impl
          (Min *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_RDI;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> u;
  Tensor t;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x2;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x1;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> y;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<float,_float,_0>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffd88;
  Dim *d;
  Tensor *in_stack_fffffffffffffda0;
  DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
  *in_stack_fffffffffffffda8;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffdb0;
  Tensor *in_stack_fffffffffffffdb8;
  Dim local_c0 [4];
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_10;
  
  local_10 = in_RSI;
  Tensor::operator*(in_stack_fffffffffffffdb8);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_10,0);
  Tensor::operator*(in_stack_fffffffffffffdb8);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_10,1);
  Tensor::operator*(in_stack_fffffffffffffdb8);
  d = local_c0;
  Tensor::Tensor(in_stack_fffffffffffffda0,d,(float *)in_RDI);
  Tensor::operator*(in_stack_fffffffffffffdb8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
  array((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *
        )d);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
  array((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *
        )d);
  Eigen::
  ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>>
  ::operator<((ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_stack_fffffffffffffdb8,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_stack_fffffffffffffdb0);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  ::matrix((ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
            *)d);
  Eigen::
  DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
  ::cast<float>(in_stack_fffffffffffffda8);
  Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>::operator=
            (in_RDI,(DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<bool,_float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
                     *)in_stack_fffffffffffffd88);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
  cwiseMin<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
            ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>::operator=
            (in_RDI,in_stack_fffffffffffffd88);
  Tensor::~Tensor((Tensor *)0x3ccb74);
  return;
}

Assistant:

void Min::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Min not yet implemented for CUDA");
#else
  auto y = *fx;
  auto x1 = **xs[0];
  auto x2 = **xs[1];
  Tensor t(fx.d, static_cast<float*>(aux_mem));
  auto u = *t;
  u = (x1.array() < x2.array()).matrix().cast<float>();
  y = x1.cwiseMin(x2);
#endif
}